

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::GetOptionWasSet(MetaCommand *this,string *optionName)

{
  pointer pOVar1;
  pointer pOVar2;
  __type _Var3;
  pointer __lhs;
  
  pOVar2 = (this->m_ParsedOptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    __lhs = pOVar2;
    pOVar1 = (this->m_ParsedOptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__lhs == pOVar1) break;
    _Var3 = std::operator==(&__lhs->name,optionName);
    pOVar2 = __lhs + 1;
  } while (!_Var3);
  return __lhs != pOVar1;
}

Assistant:

bool MetaCommand::
GetOptionWasSet( METAIO_STL::string optionName)
{
  OptionVector::const_iterator it = m_ParsedOptionVector.begin();
  while(it != m_ParsedOptionVector.end())
    {
    if((*it).name == optionName)
      {
      return true;
      }
    ++it;
    }
  return false;
}